

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O0

void __thiscall t_html_generator::generate_program(t_html_generator *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  int *piVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  string *psVar7;
  ostream *poVar8;
  vector<t_const_*,_std::allocator<t_const_*>_> *pvVar9;
  vector<t_enum_*,_std::allocator<t_enum_*>_> *pvVar10;
  reference pptVar11;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> *pvVar12;
  reference pptVar13;
  vector<t_struct_*,_std::allocator<t_struct_*>_> *pvVar14;
  reference pptVar15;
  vector<t_service_*,_std::allocator<t_service_*>_> *pvVar16;
  reference pptVar17;
  int __oflag;
  string local_240 [32];
  __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_> local_220
  ;
  t_service **local_218;
  __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_> local_210
  ;
  iterator sv_iter;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_> local_1e0;
  iterator o_iter;
  vector<t_struct_*,_std::allocator<t_struct_*>_> objects;
  __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_> local_1b0
  ;
  iterator td_iter;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> typedefs;
  __normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_> local_180;
  iterator en_iter;
  vector<t_enum_*,_std::allocator<t_enum_*>_> enums;
  undefined1 local_148 [8];
  vector<t_const_*,_std::allocator<t_const_*>_> consts;
  string local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  string fname;
  allocator local_a5 [13];
  undefined1 local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [36];
  int local_14;
  t_html_generator *ptStack_10;
  int r;
  t_html_generator *this_local;
  
  ptStack_10 = this;
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(local_38);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = mkdir(pcVar4,0x1ff);
  std::__cxx11::string::~string(local_38);
  local_14 = iVar2;
  if (iVar2 == -1) {
    piVar5 = __errno_location();
    if (*piVar5 != 0x11) {
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      (*(this->super_t_generator)._vptr_t_generator[0x1b])(local_98);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_78,pcVar4,local_a5);
      std::operator+(&local_58,&local_78,": ");
      piVar5 = __errno_location();
      pcVar4 = strerror(*piVar5);
      std::operator+(pbVar6,&local_58,pcVar4);
      __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  psVar7 = t_program::get_name_abi_cxx11_((this->super_t_generator).program_);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (fname.field_2._M_local_buf + 8);
  std::operator+(pbVar6,psVar7,".html");
  std::__cxx11::string::operator=((string *)&this->current_file_,(string *)pbVar6);
  std::__cxx11::string::~string((string *)pbVar6);
  (*(this->super_t_generator)._vptr_t_generator[0x1b])();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                 &local_108,&this->current_file_);
  std::__cxx11::string::~string((string *)&local_108);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_128,pcVar4,
             (allocator *)
             ((long)&consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_out_,(char *)local_128,__oflag);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  poVar8 = std::operator<<((ostream *)&this->f_out_,"<!DOCTYPE html>");
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<((ostream *)&this->f_out_,"<html lang=\"en\">");
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<((ostream *)&this->f_out_,"<head>");
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<((ostream *)&this->f_out_,
                           "<meta http-equiv=\"Content-Type\" content=\"text/html;charset=utf-8\" />"
                          );
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  generate_style_tag(this);
  poVar8 = std::operator<<((ostream *)&this->f_out_,"<title>Thrift module: ");
  psVar7 = t_program::get_name_abi_cxx11_((this->super_t_generator).program_);
  poVar8 = std::operator<<(poVar8,(string *)psVar7);
  poVar8 = std::operator<<(poVar8,"</title></head><body>");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<(poVar8,"<div class=\"container-fluid\">");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<(poVar8,"<h1>Thrift module: ");
  psVar7 = t_program::get_name_abi_cxx11_((this->super_t_generator).program_);
  poVar8 = std::operator<<(poVar8,(string *)psVar7);
  poVar8 = std::operator<<(poVar8,"</h1>");
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  print_doc(this,&((this->super_t_generator).program_)->super_t_doc);
  generate_program_toc(this);
  pvVar9 = t_program::get_consts((this->super_t_generator).program_);
  bVar1 = std::vector<t_const_*,_std::allocator<t_const_*>_>::empty(pvVar9);
  if (!bVar1) {
    poVar8 = std::operator<<((ostream *)&this->f_out_,"<hr/><h2 id=\"Constants\">Constants</h2>");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    pvVar9 = t_program::get_consts((this->super_t_generator).program_);
    std::vector<t_const_*,_std::allocator<t_const_*>_>::vector
              ((vector<t_const_*,_std::allocator<t_const_*>_> *)local_148,pvVar9);
    std::operator<<((ostream *)&this->f_out_,
                    "<table class=\"table-bordered table-striped table-condensed\">");
    poVar8 = std::operator<<((ostream *)&this->f_out_,
                             "<thead><tr><th>Constant</th><th>Type</th><th>Value</th></tr></thead><tbody>"
                            );
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::vector<t_const_*,_std::allocator<t_const_*>_>::vector
              ((vector<t_const_*,_std::allocator<t_const_*>_> *)
               &enums.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<t_const_*,_std::allocator<t_const_*>_> *)local_148);
    (*(this->super_t_generator)._vptr_t_generator[0x11])
              (this,&enums.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    std::vector<t_const_*,_std::allocator<t_const_*>_>::~vector
              ((vector<t_const_*,_std::allocator<t_const_*>_> *)
               &enums.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::operator<<((ostream *)&this->f_out_,"</tbody></table>");
    std::vector<t_const_*,_std::allocator<t_const_*>_>::~vector
              ((vector<t_const_*,_std::allocator<t_const_*>_> *)local_148);
  }
  pvVar10 = t_program::get_enums((this->super_t_generator).program_);
  bVar1 = std::vector<t_enum_*,_std::allocator<t_enum_*>_>::empty(pvVar10);
  if (!bVar1) {
    poVar8 = std::operator<<((ostream *)&this->f_out_,
                             "<hr/><h2 id=\"Enumerations\">Enumerations</h2>");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    pvVar10 = t_program::get_enums((this->super_t_generator).program_);
    std::vector<t_enum_*,_std::allocator<t_enum_*>_>::vector
              ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter,pvVar10);
    __gnu_cxx::__normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
    __normal_iterator(&local_180);
    local_180._M_current =
         (t_enum **)
         std::vector<t_enum_*,_std::allocator<t_enum_*>_>::begin
                   ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter);
    while( true ) {
      typedefs.super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<t_enum_*,_std::allocator<t_enum_*>_>::end
                              ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter);
      bVar1 = __gnu_cxx::operator!=
                        (&local_180,
                         (__normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>
                          *)&typedefs.super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) break;
      pptVar11 = __gnu_cxx::
                 __normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
                 operator*(&local_180);
      (*(this->super_t_generator)._vptr_t_generator[0x13])(this,*pptVar11);
      __gnu_cxx::__normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
      operator++(&local_180);
    }
    std::vector<t_enum_*,_std::allocator<t_enum_*>_>::~vector
              ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter);
  }
  pvVar12 = t_program::get_typedefs((this->super_t_generator).program_);
  bVar1 = std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::empty(pvVar12);
  if (!bVar1) {
    poVar8 = std::operator<<((ostream *)&this->f_out_,
                             "<hr/><h2 id=\"Typedefs\">Type declarations</h2>");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    pvVar12 = t_program::get_typedefs((this->super_t_generator).program_);
    std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::vector
              ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter,pvVar12);
    __gnu_cxx::
    __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>::
    __normal_iterator(&local_1b0);
    local_1b0._M_current =
         (t_typedef **)
         std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::begin
                   ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter);
    while( true ) {
      objects.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::end
                              ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter);
      bVar1 = __gnu_cxx::operator!=
                        (&local_1b0,
                         (__normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>
                          *)&objects.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) break;
      pptVar13 = __gnu_cxx::
                 __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>
                 ::operator*(&local_1b0);
      (*(this->super_t_generator)._vptr_t_generator[0x12])(this,*pptVar13);
      __gnu_cxx::
      __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>::
      operator++(&local_1b0);
    }
    std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::~vector
              ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter);
  }
  pvVar14 = t_program::get_objects((this->super_t_generator).program_);
  bVar1 = std::vector<t_struct_*,_std::allocator<t_struct_*>_>::empty(pvVar14);
  if (!bVar1) {
    poVar8 = std::operator<<((ostream *)&this->f_out_,"<hr/><h2 id=\"Structs\">Data structures</h2>"
                            );
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    pvVar14 = t_program::get_objects((this->super_t_generator).program_);
    std::vector<t_struct_*,_std::allocator<t_struct_*>_>::vector
              ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter,pvVar14);
    __gnu_cxx::__normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
    ::__normal_iterator(&local_1e0);
    local_1e0._M_current =
         (t_struct **)
         std::vector<t_struct_*,_std::allocator<t_struct_*>_>::begin
                   ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter);
    while( true ) {
      services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<t_struct_*,_std::allocator<t_struct_*>_>::end
                              ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter);
      bVar1 = __gnu_cxx::operator!=
                        (&local_1e0,
                         (__normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                          *)&services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) break;
      pptVar15 = __gnu_cxx::
                 __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                 ::operator*(&local_1e0);
      uVar3 = (*((*pptVar15)->super_t_type).super_t_doc._vptr_t_doc[0xc])();
      if ((uVar3 & 1) == 0) {
        pptVar15 = __gnu_cxx::
                   __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                   ::operator*(&local_1e0);
        (*(this->super_t_generator)._vptr_t_generator[0x15])(this,*pptVar15);
      }
      else {
        pptVar15 = __gnu_cxx::
                   __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                   ::operator*(&local_1e0);
        (*(this->super_t_generator)._vptr_t_generator[0x18])(this,*pptVar15);
      }
      __gnu_cxx::
      __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>::
      operator++(&local_1e0);
    }
    std::vector<t_struct_*,_std::allocator<t_struct_*>_>::~vector
              ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter);
  }
  pvVar16 = t_program::get_services((this->super_t_generator).program_);
  bVar1 = std::vector<t_service_*,_std::allocator<t_service_*>_>::empty(pvVar16);
  if (!bVar1) {
    poVar8 = std::operator<<((ostream *)&this->f_out_,"<hr/><h2 id=\"Services\">Services</h2>");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    pvVar16 = t_program::get_services((this->super_t_generator).program_);
    std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
              ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter,pvVar16);
    __gnu_cxx::
    __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>::
    __normal_iterator(&local_210);
    local_218 = (t_service **)
                std::vector<t_service_*,_std::allocator<t_service_*>_>::begin
                          ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
    local_210._M_current = local_218;
    while( true ) {
      local_220._M_current =
           (t_service **)
           std::vector<t_service_*,_std::allocator<t_service_*>_>::end
                     ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
      bVar1 = __gnu_cxx::operator!=(&local_210,&local_220);
      if (!bVar1) break;
      pptVar17 = __gnu_cxx::
                 __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
                 ::operator*(&local_210);
      (*(this->super_t_generator)._vptr_t_generator[0x1a])(local_240,this,*pptVar17);
      std::__cxx11::string::operator=((string *)&(this->super_t_generator).service_name_,local_240);
      std::__cxx11::string::~string(local_240);
      pptVar17 = __gnu_cxx::
                 __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
                 ::operator*(&local_210);
      (*(this->super_t_generator)._vptr_t_generator[0x16])(this,*pptVar17);
      __gnu_cxx::
      __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>::
      operator++(&local_210);
    }
    std::vector<t_service_*,_std::allocator<t_service_*>_>::~vector
              ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
  }
  poVar8 = std::operator<<((ostream *)&this->f_out_,"</div></body></html>");
  iVar2 = 0x56bc18;
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&this->f_out_,iVar2);
  generate_index(this);
  generate_css(this);
  std::__cxx11::string::~string((string *)local_e8);
  return;
}

Assistant:

void t_html_generator::generate_program() {
  // Make output directory
  MKDIR(get_out_dir().c_str());
  current_file_ = program_->get_name() + ".html";
  string fname = get_out_dir() + current_file_;
  f_out_.open(fname.c_str());
  f_out_ << "<!DOCTYPE html>" << endl;
  f_out_ << "<html lang=\"en\">" << endl;
  f_out_ << "<head>" << endl;
  f_out_ << "<meta http-equiv=\"Content-Type\" content=\"text/html;charset=utf-8\" />" << endl;
  generate_style_tag();
  f_out_ << "<title>Thrift module: " << program_->get_name() << "</title></head><body>" << endl
         << "<div class=\"container-fluid\">" << endl
         << "<h1>Thrift module: " << program_->get_name() << "</h1>" << endl;

  print_doc(program_);

  generate_program_toc();

  if (!program_->get_consts().empty()) {
    f_out_ << "<hr/><h2 id=\"Constants\">Constants</h2>" << endl;
    vector<t_const*> consts = program_->get_consts();
    f_out_ << "<table class=\"table-bordered table-striped table-condensed\">";
    f_out_ << "<thead><tr><th>Constant</th><th>Type</th><th>Value</th></tr></thead><tbody>" << endl;
    generate_consts(consts);
    f_out_ << "</tbody></table>";
  }

  if (!program_->get_enums().empty()) {
    f_out_ << "<hr/><h2 id=\"Enumerations\">Enumerations</h2>" << endl;
    // Generate enums
    vector<t_enum*> enums = program_->get_enums();
    vector<t_enum*>::iterator en_iter;
    for (en_iter = enums.begin(); en_iter != enums.end(); ++en_iter) {
      generate_enum(*en_iter);
    }
  }

  if (!program_->get_typedefs().empty()) {
    f_out_ << "<hr/><h2 id=\"Typedefs\">Type declarations</h2>" << endl;
    // Generate typedefs
    vector<t_typedef*> typedefs = program_->get_typedefs();
    vector<t_typedef*>::iterator td_iter;
    for (td_iter = typedefs.begin(); td_iter != typedefs.end(); ++td_iter) {
      generate_typedef(*td_iter);
    }
  }

  if (!program_->get_objects().empty()) {
    f_out_ << "<hr/><h2 id=\"Structs\">Data structures</h2>" << endl;
    // Generate structs and exceptions in declared order
    vector<t_struct*> objects = program_->get_objects();
    vector<t_struct*>::iterator o_iter;
    for (o_iter = objects.begin(); o_iter != objects.end(); ++o_iter) {
      if ((*o_iter)->is_xception()) {
        generate_xception(*o_iter);
      } else {
        generate_struct(*o_iter);
      }
    }
  }

  if (!program_->get_services().empty()) {
    f_out_ << "<hr/><h2 id=\"Services\">Services</h2>" << endl;
    // Generate services
    vector<t_service*> services = program_->get_services();
    vector<t_service*>::iterator sv_iter;
    for (sv_iter = services.begin(); sv_iter != services.end(); ++sv_iter) {
      service_name_ = get_service_name(*sv_iter);
      generate_service(*sv_iter);
    }
  }

  f_out_ << "</div></body></html>" << endl;
  f_out_.close();

  generate_index();
  generate_css();
}